

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.tpl.h
# Opt level: O1

Code * __thiscall
r_exec::Mem<r_exec::LObject,_r_exec::MemVolatile>::build_object
          (Mem<r_exec::LObject,_r_exec::MemVolatile> *this,Atom *head)

{
  char cVar1;
  short sVar2;
  int iVar3;
  Code *this_00;
  undefined4 extraout_var;
  Atom *pAVar4;
  
  pAVar4 = head;
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 == -0x38) {
    this_00 = (Code *)operator_new(0x448);
    r_exec::Group::Group((Group *)this_00,(Mem *)0x0);
  }
  else {
    sVar2 = r_code::Atom::asOpcode();
    if (sVar2 == (short)Opcodes::Fact) {
      this_00 = (Code *)r_exec::Fact::operator_new((Fact *)0x150,(ulong)pAVar4);
      r_exec::Fact::Fact((Fact *)this_00);
    }
    else if (sVar2 == (short)Opcodes::AntiFact) {
      this_00 = (Code *)r_exec::AntiFact::operator_new((AntiFact *)0x150,(ulong)pAVar4);
      r_exec::AntiFact::AntiFact((AntiFact *)this_00);
    }
    else if (sVar2 == (short)Opcodes::Pred) {
      this_00 = (Code *)operator_new(0x180);
      r_exec::Pred::Pred((Pred *)this_00);
    }
    else if (sVar2 == (short)Opcodes::Goal) {
      this_00 = (Code *)operator_new(0x160);
      r_exec::Goal::Goal((Goal *)this_00);
    }
    else if (sVar2 == (short)Opcodes::ICst) {
      this_00 = (Code *)operator_new(0x170);
      r_exec::ICST::ICST((ICST *)this_00);
    }
    else if (sVar2 == (short)Opcodes::MkRdx) {
      this_00 = (Code *)operator_new(0x158);
      r_exec::MkRdx::MkRdx((MkRdx *)this_00);
    }
    else if ((((((sVar2 == (short)Opcodes::MkActChg) || (sVar2 == (short)Opcodes::MkHighAct)) ||
               (sVar2 == (short)Opcodes::MkHighSln)) ||
              ((sVar2 == (short)Opcodes::MkLowAct || (sVar2 == (short)Opcodes::MkLowRes)))) ||
             ((sVar2 == (short)Opcodes::MkLowSln ||
              ((sVar2 == (short)Opcodes::MkNew || (sVar2 == (short)Opcodes::MkSlnChg)))))) ||
            ((sVar2 == (short)Opcodes::Success || (sVar2 == (short)Opcodes::Perf)))) {
      this_00 = (Code *)operator_new(200);
      r_code::Code::Code(this_00);
      (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__LObject_0011c9b0;
      this_00[1].super__Object.refCount.super___atomic_base<long>._M_i = 0;
      this_00[1].storage_index = 0;
      this_00[1].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      this_00[1].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00[1].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00[1].markers.used_cells_head = 0;
    }
    else {
      this_00 = (Code *)operator_new(0x150);
      r_code::Code::Code(this_00);
      this_00[1].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00[1].markers.used_cells_head = 0;
      this_00[1].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      this_00[1].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00[1].super__Object.refCount.super___atomic_base<long>._M_i = 0;
      this_00[1].storage_index = 0;
      this_00[1].markers.used_cells_tail = 0;
      this_00[1].markers.free_cells = 0;
      this_00[1].markers.used_cell_count = 0;
      this_00[1].markers.free_cell_count = 0;
      this_00[1].views._M_h._M_buckets = (__buckets_ptr)0x0;
      this_00[1].views._M_h._M_bucket_count = 0;
      this_00[1].views._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      this_00[1].views._M_h._M_element_count = 0;
      *(undefined8 *)&this_00[1].views._M_h._M_rehash_policy = 0;
      this_00[1].views._M_h._M_rehash_policy._M_next_resize = 0;
      this_00[1].views._M_h._M_single_bucket = (__node_base_ptr)0x0;
      this_00[2].super__Object._vptr__Object = (_func_int **)0x0;
      this_00[2].super__Object.refCount.super___atomic_base<long>._M_i = 0;
      this_00[2].storage_index = 0;
      this_00[2].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      this_00[2].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00[2].markers.cells.
      super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_00[1].super__Object._vptr__Object = (_func_int **)0xffffffff;
      (this_00->super__Object)._vptr__Object = (_func_int **)&PTR__Object_0011c780;
    }
  }
  iVar3 = (*(this_00->super__Object)._vptr__Object[4])(this_00,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar3),head);
  return this_00;
}

Assistant:

r_code::Code *Mem<O, S>::build_object(Atom head) const
{
    r_code::Code *object;

    switch (head.getDescriptor()) {
    case Atom::GROUP:
        object = new Group();
        break;

    default: {
        uint16_t opcode = head.asOpcode();

        if (opcode == Opcodes::Fact) {
            object = new Fact();
        } else if (opcode == Opcodes::AntiFact) {
            object = new AntiFact();
        } else if (opcode == Opcodes::Pred) {
            object = new Pred();
        } else if (opcode == Opcodes::Goal) {
            object = new Goal();
        } else if (opcode == Opcodes::ICst) {
            object = new ICST();
        } else if (opcode == Opcodes::MkRdx) {
            object = new MkRdx();
        } else if (opcode == Opcodes::MkActChg ||
                   opcode == Opcodes::MkHighAct ||
                   opcode == Opcodes::MkHighSln ||
                   opcode == Opcodes::MkLowAct ||
                   opcode == Opcodes::MkLowRes ||
                   opcode == Opcodes::MkLowSln ||
                   opcode == Opcodes::MkNew ||
                   opcode == Opcodes::MkSlnChg ||
                   opcode == Opcodes::Success ||
                   opcode == Opcodes::Perf) {
            object = new r_code::LObject();
        } else if (O::RequiresPacking()) {
            object = new r_code::LObject();    // temporary sand box for assembling code; will be packed into an O at injection time.
        } else {
            object = new O();
        }

        break;
    }
    }

    object->code(0) = head;
    return object;
}